

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc_sse2.c
# Opt level: O0

void aom_highbd_upsampled_pred_sse2
               (MACROBLOCKD *xd,AV1Common *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred8,
               int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref8,int ref_stride,
               int bd,int subpel_search)

{
  undefined8 uVar1;
  int subsampling_y;
  scale_factors *psVar2;
  int16_t *piVar3;
  int16_t *piVar4;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  MACROBLOCKD *in_RDI;
  uint8_t *in_R9;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  uint8_t *in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000040;
  int intermediate_height;
  uint16_t *temp_start_vert;
  uint16_t *temp_start_horiz;
  uint8_t *ref_start;
  int16_t *kernel_y;
  int16_t *kernel_x;
  uint16_t temp [20480];
  int16_t *kernel_1;
  int16_t *kernel;
  __m128i t0;
  __m128i s1;
  __m128i s0_1;
  int i_1;
  __m128i s0;
  int j;
  int i;
  uint16_t *comp_pred;
  uint16_t *ref;
  int filter_taps;
  InterpFilterParams *filter;
  int_interpfilters filters;
  InterPredParams inter_pred_params;
  buf_2d *pre_buf;
  buf_2d *dst_buf;
  macroblockd_plane *pd;
  int mi_y;
  int mi_x;
  int plane;
  int is_scaled;
  scale_factors *sf;
  int is_intrabc;
  int ref_num;
  MB_MODE_INFO *mi;
  undefined8 in_stack_ffffffffffff5c98;
  undefined4 uVar5;
  InterPredParams *inter_pred_params_00;
  undefined4 in_stack_ffffffffffff5ca0;
  int iVar6;
  undefined4 in_stack_ffffffffffff5ca4;
  int in_stack_ffffffffffff5cac;
  int in_stack_ffffffffffff5cb0;
  int iVar7;
  int in_stack_ffffffffffff5cb4;
  int in_stack_ffffffffffff5ccc;
  InterPredParams *in_stack_ffffffffffff5cd0;
  undefined1 *puVar8;
  int_interpfilters interp_filters;
  int bit_depth;
  buf_2d *pbVar9;
  int use_hbd_buf;
  int in_stack_ffffffffffff5d08;
  scale_factors *in_stack_ffffffffffff5d10;
  undefined1 *puVar10;
  buf_2d *in_stack_ffffffffffff5d18;
  undefined1 local_a2c8 [40960];
  int16_t *local_2c8;
  int16_t *local_2c0;
  int local_27c;
  int local_268;
  int local_264;
  undefined8 *local_260;
  undefined8 *local_258;
  int local_24c;
  InterpFilterParams *local_248;
  int_interpfilters local_23c;
  undefined1 local_238 [96];
  undefined1 auStack_1d8 [168];
  buf_2d *local_130;
  buf_2d *local_128;
  macroblockd_plane *local_120;
  int local_118;
  int local_114;
  undefined4 local_110;
  int local_10c;
  scale_factors *local_108;
  int local_100;
  undefined4 local_fc;
  MB_MODE_INFO *local_f8;
  uint8_t *local_f0;
  int local_e0;
  int local_dc;
  long local_d8;
  MACROBLOCKD *local_d0;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffff5c98 >> 0x20);
  local_f0 = in_R9;
  if (in_RDI != (MACROBLOCKD *)0x0) {
    local_f8 = *in_RDI->mi;
    local_fc = 0;
    local_e0 = in_ECX;
    local_dc = in_EDX;
    local_d8 = in_RSI;
    local_d0 = in_RDI;
    local_100 = is_intrabc_block(local_f8);
    if (local_100 == 0) {
      psVar2 = local_d0->block_ref_scale_factors[0];
    }
    else {
      psVar2 = (scale_factors *)(local_d8 + 0x110);
    }
    local_108 = psVar2;
    local_10c = av1_is_scaled((scale_factors *)
                              CONCAT44(in_stack_ffffffffffff5ca4,in_stack_ffffffffffff5ca0));
    use_hbd_buf = (int)psVar2;
    if (local_10c != 0) {
      local_110 = 0;
      local_114 = local_e0 << 2;
      local_118 = local_dc << 2;
      local_120 = local_d0->plane;
      local_128 = &local_d0->plane[0].dst;
      pbVar9 = local_128;
      if (local_100 == 0) {
        pbVar9 = local_d0->plane[0].pre;
      }
      puVar8 = auStack_1d8;
      local_130 = pbVar9;
      get_conv_params(in_stack_ffffffffffff5cb4,in_stack_ffffffffffff5cb0,in_stack_ffffffffffff5cac)
      ;
      bit_depth = (int)pbVar9;
      memcpy(puVar8,local_238,0x30);
      interp_filters.as_int = (uint32_t)((ulong)puVar8 >> 0x20);
      local_23c = av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
      subsampling_y = local_114 >> ((byte)local_120->subsampling_x & 0x1f);
      iVar7 = local_120->subsampling_y;
      iVar6 = local_d0->bd;
      is_cur_buf_hbd(local_d0);
      inter_pred_params_00 = (InterPredParams *)CONCAT44(uVar5,iVar7);
      iVar7 = local_100;
      av1_init_inter_params
                (in_stack_ffffffffffff5cd0,in_stack_ffffffffffff5ccc,local_23c.as_int,
                 (int)((ulong)local_130 >> 0x20),(int)local_130,(int)((ulong)local_108 >> 0x20),
                 subsampling_y,bit_depth,use_hbd_buf,in_stack_ffffffffffff5d08,
                 in_stack_ffffffffffff5d10,in_stack_ffffffffffff5d18,interp_filters);
      av1_enc_build_one_inter_predictor
                ((uint8_t *)CONCAT44(in_stack_ffffffffffff5cb4,iVar7),in_stack_ffffffffffff5cac,
                 (MV *)CONCAT44(in_stack_ffffffffffff5ca4,iVar6),inter_pred_params_00);
      return;
    }
    local_10c = 0;
  }
  local_248 = av1_get_filter(in_stack_00000040);
  local_24c = 8;
  if (in_stack_00000040 < 3) {
    local_24c = 4;
  }
  if ((in_stack_00000018 == 0) && (in_stack_00000020 == 0)) {
    local_258 = (undefined8 *)((long)in_stack_00000028 << 1);
    local_260 = (undefined8 *)((long)local_f0 << 1);
    if (in_stack_00000008 < 8) {
      for (local_27c = 0; local_27c < in_stack_00000010; local_27c = local_27c + 2) {
        uVar1 = *(undefined8 *)((long)local_258 + (long)in_stack_00000030 * 2);
        *local_260 = *local_258;
        local_260[1] = uVar1;
        local_260 = local_260 + 2;
        local_258 = (undefined8 *)((long)local_258 + (long)(in_stack_00000030 << 1) * 2);
      }
    }
    else {
      for (local_264 = 0; local_264 < in_stack_00000010; local_264 = local_264 + 1) {
        for (local_268 = 0; local_268 < in_stack_00000008; local_268 = local_268 + 8) {
          uVar1 = local_258[1];
          *local_260 = *local_258;
          local_260[1] = uVar1;
          local_260 = local_260 + 2;
          local_258 = local_258 + 2;
        }
        local_258 = (undefined8 *)
                    ((long)local_258 + (long)(in_stack_00000030 - in_stack_00000008) * 2);
      }
    }
  }
  else if (in_stack_00000020 == 0) {
    local_2c0 = av1_get_interp_filter_subpel_kernel(local_248,in_stack_00000018 << 1);
    (*aom_highbd_convolve8_horiz)
              (in_stack_00000028,(long)in_stack_00000030,local_f0,(long)in_stack_00000008,local_2c0,
               0x10,(int16_t *)0x0,-1,in_stack_00000008,in_stack_00000010,in_stack_00000038);
  }
  else if (in_stack_00000018 == 0) {
    local_2c8 = av1_get_interp_filter_subpel_kernel(local_248,in_stack_00000020 << 1);
    (*aom_highbd_convolve8_vert)
              (in_stack_00000028,(long)in_stack_00000030,local_f0,(long)in_stack_00000008,
               (int16_t *)0x0,-1,local_2c8,0x10,in_stack_00000008,in_stack_00000010,
               in_stack_00000038);
  }
  else {
    piVar3 = av1_get_interp_filter_subpel_kernel(local_248,in_stack_00000018 << 1);
    piVar4 = av1_get_interp_filter_subpel_kernel(local_248,in_stack_00000020 << 1);
    if (in_stack_00000040 < 3) {
      puVar8 = local_a2c8 + (long)((local_24c >> 1) << 7) * 2;
    }
    else {
      puVar8 = local_a2c8;
    }
    puVar10 = local_a2c8 + (long)((((int)(uint)local_248->taps >> 1) + -1) * 0x80) * 2;
    (*aom_highbd_convolve8_horiz)
              (in_stack_00000028 + -(long)(in_stack_00000030 * ((local_24c >> 1) + -1)),
               (long)in_stack_00000030,(uint8_t *)((ulong)puVar8 >> 1),0x80,piVar3,0x10,
               (int16_t *)0x0,-1,in_stack_00000008,
               ((in_stack_00000010 + -1) * 8 + in_stack_00000020 >> 3) + local_24c,in_stack_00000038
              );
    (*aom_highbd_convolve8_vert)
              ((uint8_t *)((ulong)puVar10 >> 1),0x80,local_f0,(long)in_stack_00000008,(int16_t *)0x0
               ,-1,piVar4,0x10,in_stack_00000008,in_stack_00000010,in_stack_00000038);
  }
  return;
}

Assistant:

void aom_highbd_upsampled_pred_sse2(MACROBLOCKD *xd,
                                    const struct AV1Common *const cm,
                                    int mi_row, int mi_col, const MV *const mv,
                                    uint8_t *comp_pred8, int width, int height,
                                    int subpel_x_q3, int subpel_y_q3,
                                    const uint8_t *ref8, int ref_stride, int bd,
                                    int subpel_search) {
  // expect xd == NULL only in tests
  if (xd != NULL) {
    const MB_MODE_INFO *mi = xd->mi[0];
    const int ref_num = 0;
    const int is_intrabc = is_intrabc_block(mi);
    const struct scale_factors *const sf =
        is_intrabc ? &cm->sf_identity : xd->block_ref_scale_factors[ref_num];
    const int is_scaled = av1_is_scaled(sf);

    if (is_scaled) {
      int plane = 0;
      const int mi_x = mi_col * MI_SIZE;
      const int mi_y = mi_row * MI_SIZE;
      const struct macroblockd_plane *const pd = &xd->plane[plane];
      const struct buf_2d *const dst_buf = &pd->dst;
      const struct buf_2d *const pre_buf =
          is_intrabc ? dst_buf : &pd->pre[ref_num];

      InterPredParams inter_pred_params;
      inter_pred_params.conv_params = get_conv_params(0, plane, xd->bd);
      const int_interpfilters filters =
          av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
      av1_init_inter_params(
          &inter_pred_params, width, height, mi_y >> pd->subsampling_y,
          mi_x >> pd->subsampling_x, pd->subsampling_x, pd->subsampling_y,
          xd->bd, is_cur_buf_hbd(xd), is_intrabc, sf, pre_buf, filters);
      av1_enc_build_one_inter_predictor(comp_pred8, width, mv,
                                        &inter_pred_params);
      return;
    }
  }

  const InterpFilterParams *filter = av1_get_filter(subpel_search);
  int filter_taps = (subpel_search <= USE_4_TAPS) ? 4 : SUBPEL_TAPS;
  if (!subpel_x_q3 && !subpel_y_q3) {
    uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
    uint16_t *comp_pred = CONVERT_TO_SHORTPTR(comp_pred8);
    if (width >= 8) {
      int i;
      assert(!(width & 7));
      /*Read 8 pixels one row at a time.*/
      for (i = 0; i < height; i++) {
        int j;
        for (j = 0; j < width; j += 8) {
          __m128i s0 = _mm_loadu_si128((const __m128i *)ref);
          _mm_storeu_si128((__m128i *)comp_pred, s0);
          comp_pred += 8;
          ref += 8;
        }
        ref += ref_stride - width;
      }
    } else {
      int i;
      assert(!(width & 3));
      /*Read 4 pixels two rows at a time.*/
      for (i = 0; i < height; i += 2) {
        __m128i s0 = _mm_loadl_epi64((const __m128i *)ref);
        __m128i s1 = _mm_loadl_epi64((const __m128i *)(ref + ref_stride));
        __m128i t0 = _mm_unpacklo_epi64(s0, s1);
        _mm_storeu_si128((__m128i *)comp_pred, t0);
        comp_pred += 8;
        ref += 2 * ref_stride;
      }
    }
  } else if (!subpel_y_q3) {
    const int16_t *const kernel =
        av1_get_interp_filter_subpel_kernel(filter, subpel_x_q3 << 1);
    aom_highbd_convolve8_horiz(ref8, ref_stride, comp_pred8, width, kernel, 16,
                               NULL, -1, width, height, bd);
  } else if (!subpel_x_q3) {
    const int16_t *const kernel =
        av1_get_interp_filter_subpel_kernel(filter, subpel_y_q3 << 1);
    aom_highbd_convolve8_vert(ref8, ref_stride, comp_pred8, width, NULL, -1,
                              kernel, 16, width, height, bd);
  } else {
    DECLARE_ALIGNED(16, uint16_t,
                    temp[((MAX_SB_SIZE + 16) + 16) * MAX_SB_SIZE]);
    const int16_t *const kernel_x =
        av1_get_interp_filter_subpel_kernel(filter, subpel_x_q3 << 1);
    const int16_t *const kernel_y =
        av1_get_interp_filter_subpel_kernel(filter, subpel_y_q3 << 1);
    const uint8_t *ref_start = ref8 - ref_stride * ((filter_taps >> 1) - 1);
    uint16_t *temp_start_horiz = (subpel_search <= USE_4_TAPS)
                                     ? temp + (filter_taps >> 1) * MAX_SB_SIZE
                                     : temp;
    uint16_t *temp_start_vert = temp + MAX_SB_SIZE * ((filter->taps >> 1) - 1);
    const int intermediate_height =
        (((height - 1) * 8 + subpel_y_q3) >> 3) + filter_taps;
    assert(intermediate_height <= (MAX_SB_SIZE * 2 + 16) + 16);
    aom_highbd_convolve8_horiz(
        ref_start, ref_stride, CONVERT_TO_BYTEPTR(temp_start_horiz),
        MAX_SB_SIZE, kernel_x, 16, NULL, -1, width, intermediate_height, bd);
    aom_highbd_convolve8_vert(CONVERT_TO_BYTEPTR(temp_start_vert), MAX_SB_SIZE,
                              comp_pred8, width, NULL, -1, kernel_y, 16, width,
                              height, bd);
  }
}